

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regenc.c
# Opt level: O2

int onigenc_mb4_is_code_ctype(OnigEncoding enc,OnigCodePoint code,uint ctype)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = 0;
  if (code < 0x80) {
    if (ctype < 0xf) {
      return (int)((OnigEncAsciiCtypeTable[code] >> (ctype & 0x1f) & 1) != 0);
    }
  }
  else if ((ctype < 0xd) && ((0x10a0U >> (ctype & 0x1f) & 1) != 0)) {
    iVar2 = (*enc->code_to_mbclen)(code);
    uVar1 = (uint)(1 < iVar2);
  }
  return uVar1;
}

Assistant:

extern int
onigenc_mb4_is_code_ctype(OnigEncoding enc, OnigCodePoint code,
                          unsigned int ctype)
{
  if (code < 128) {
    if (ctype <= ONIGENC_MAX_STD_CTYPE)
      return ONIGENC_IS_ASCII_CODE_CTYPE(code, ctype);
  }
  else {
    if (CTYPE_IS_WORD_GRAPH_PRINT(ctype)) {
      return (ONIGENC_CODE_TO_MBCLEN(enc, code) > 1 ? TRUE : FALSE);
    }
  }

  return FALSE;
}